

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O2

void __thiscall
wasm::GeneticLearner<Order,_double,_Generator>::sort(GeneticLearner<Order,_double,_Generator> *this)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<std::unique_ptr<Order,_std::default_delete<Order>_>_*,_std::vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>_>
  __i;
  pointer puVar5;
  
  puVar1 = (this->population).
           super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->population).
           super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    uVar4 = (long)puVar2 - (long)puVar1 >> 3;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>*,std::vector<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>,std::allocator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::GeneticLearner<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,double,wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator>::sort()::_lambda(std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&,std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&)_1_>>
              (puVar1,puVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)puVar2 - (long)puVar1 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>*,std::vector<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>,std::allocator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::GeneticLearner<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,double,wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator>::sort()::_lambda(std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&,std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&)_1_>>
                (puVar1,puVar2);
      return;
    }
    puVar5 = puVar1 + 0x10;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>*,std::vector<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>,std::allocator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::GeneticLearner<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,double,wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator>::sort()::_lambda(std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&,std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&)_1_>>
              (puVar1,puVar5);
    for (; puVar5 != puVar2; puVar5 = puVar5 + 1) {
      std::
      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>*,std::vector<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>,std::allocator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>>>>,__gnu_cxx::__ops::_Val_comp_iter<wasm::GeneticLearner<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,double,wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator>::sort()::_lambda(std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&,std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&)_1_>>
                (puVar5);
    }
  }
  return;
}

Assistant:

void sort() {
    std::sort(population.begin(),
              population.end(),
              [](const unique_ptr& left, const unique_ptr& right) {
                return left->getFitness() > right->getFitness();
              });
  }